

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O2

void m68k_op_jsr_32_pcix(void)

{
  uint uVar1;
  
  uVar1 = m68ki_get_ea_pcix();
  m68ki_push_32(m68ki_cpu.pc);
  m68ki_cpu.pc = uVar1;
  return;
}

Assistant:

static void m68k_op_jsr_32_pcix(void)
{
	uint ea = EA_PCIX_32();
	m68ki_trace_t0();				   /* auto-disable (see m68kcpu.h) */
	m68ki_push_32(REG_PC);
	m68ki_jump(ea);
}